

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_impl.h
# Opt level: O3

int secp256k1_der_parse_integer(secp256k1_scalar *r,uchar **sig,uchar *sigend)

{
  uchar uVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  uchar *puVar5;
  ulong __n;
  int overflow;
  uchar ra [32];
  int local_5c;
  uchar local_58 [40];
  
  local_5c = 0;
  local_58[0x10] = '\0';
  local_58[0x11] = '\0';
  local_58[0x12] = '\0';
  local_58[0x13] = '\0';
  local_58[0x14] = '\0';
  local_58[0x15] = '\0';
  local_58[0x16] = '\0';
  local_58[0x17] = '\0';
  local_58[0x18] = '\0';
  local_58[0x19] = '\0';
  local_58[0x1a] = '\0';
  local_58[0x1b] = '\0';
  local_58[0x1c] = '\0';
  local_58[0x1d] = '\0';
  local_58[0x1e] = '\0';
  local_58[0x1f] = '\0';
  local_58[0] = '\0';
  local_58[1] = '\0';
  local_58[2] = '\0';
  local_58[3] = '\0';
  local_58[4] = '\0';
  local_58[5] = '\0';
  local_58[6] = '\0';
  local_58[7] = '\0';
  local_58[8] = '\0';
  local_58[9] = '\0';
  local_58[10] = '\0';
  local_58[0xb] = '\0';
  local_58[0xc] = '\0';
  local_58[0xd] = '\0';
  local_58[0xe] = '\0';
  local_58[0xf] = '\0';
  puVar5 = *sig;
  if (puVar5 == sigend) {
    return 0;
  }
  if (*puVar5 != '\x02') {
    return 0;
  }
  *sig = puVar5 + 1;
  uVar4 = secp256k1_der_read_len(sig,sigend);
  if ((int)uVar4 < 1) {
    return 0;
  }
  puVar5 = *sig;
  if (sigend < puVar5 + uVar4) {
    return 0;
  }
  uVar1 = *puVar5;
  if (uVar4 == 1 || uVar1 != '\0') {
    if (uVar1 == 0xff && uVar4 != 1) {
      if ((char)puVar5[1] < '\0') {
        return 0;
      }
    }
    else {
      bVar3 = true;
      if (-1 < (char)uVar1) goto LAB_001189de;
    }
    local_5c = 1;
    bVar3 = false;
  }
  else {
    if (-1 < (char)puVar5[1]) {
      return 0;
    }
    bVar3 = true;
  }
LAB_001189de:
  do {
    if (*puVar5 != '\0') {
      if (uVar4 < 0x21) goto LAB_00118a01;
      goto LAB_00118a38;
    }
    puVar5 = puVar5 + 1;
    *sig = puVar5;
    bVar2 = 1 < (int)uVar4;
    uVar4 = uVar4 - 1;
  } while (bVar2);
  uVar4 = 0;
LAB_00118a01:
  if (bVar3) {
    __n = (ulong)uVar4;
    memcpy(local_58 + (0x20 - __n),puVar5,__n);
    secp256k1_scalar_set_b32(r,local_58,&local_5c);
    if (local_5c == 0) goto LAB_00118a47;
  }
LAB_00118a38:
  __n = (ulong)uVar4;
  r->d[2] = 0;
  r->d[3] = 0;
  r->d[0] = 0;
  r->d[1] = 0;
LAB_00118a47:
  *sig = *sig + __n;
  return 1;
}

Assistant:

static int secp256k1_der_parse_integer(secp256k1_scalar *r, const unsigned char **sig, const unsigned char *sigend) {
    int overflow = 0;
    unsigned char ra[32] = {0};
    int rlen;

    if (*sig == sigend || **sig != 0x02) {
        /* Not a primitive integer (X.690-0207 8.3.1). */
        return 0;
    }
    (*sig)++;
    rlen = secp256k1_der_read_len(sig, sigend);
    if (rlen <= 0 || (*sig) + rlen > sigend) {
        /* Exceeds bounds or not at least length 1 (X.690-0207 8.3.1).  */
        return 0;
    }
    if (**sig == 0x00 && rlen > 1 && (((*sig)[1]) & 0x80) == 0x00) {
        /* Excessive 0x00 padding. */
        return 0;
    }
    if (**sig == 0xFF && rlen > 1 && (((*sig)[1]) & 0x80) == 0x80) {
        /* Excessive 0xFF padding. */
        return 0;
    }
    if ((**sig & 0x80) == 0x80) {
        /* Negative. */
        overflow = 1;
    }
    while (rlen > 0 && **sig == 0) {
        /* Skip leading zero bytes */
        rlen--;
        (*sig)++;
    }
    if (rlen > 32) {
        overflow = 1;
    }
    if (!overflow) {
        memcpy(ra + 32 - rlen, *sig, rlen);
        secp256k1_scalar_set_b32(r, ra, &overflow);
    }
    if (overflow) {
        secp256k1_scalar_set_int(r, 0);
    }
    (*sig) += rlen;
    return 1;
}